

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void g_editor_freepdinstance(void)

{
  _instanceeditor *p_Var1;
  
  if (*(_binbuf **)(pd_maininstance.pd_gui)->i_editor != (_binbuf *)0x0) {
    binbuf_free(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  }
  p_Var1 = (pd_maininstance.pd_gui)->i_editor;
  if (*(long *)(p_Var1 + 0x28) != 0) {
    if (*(code **)(p_Var1 + 0x18) == (code *)0x0) {
      bug("g_editor_freepdinstance");
    }
    else {
      (**(code **)(p_Var1 + 0x18))(*(undefined8 *)(p_Var1 + 0x30),*(long *)(p_Var1 + 0x28),0);
    }
  }
  if (*(_binbuf **)((pd_maininstance.pd_gui)->i_editor + 0x60) != (_binbuf *)0x0) {
    binbuf_free(*(_binbuf **)((pd_maininstance.pd_gui)->i_editor + 0x60));
  }
  freebytes((pd_maininstance.pd_gui)->i_editor,0x98);
  return;
}

Assistant:

void g_editor_freepdinstance(void)
{
    if (EDITOR->copy_binbuf)
        binbuf_free(EDITOR->copy_binbuf);
    if (EDITOR->canvas_undo_buf)
    {
        if (!EDITOR->canvas_undo_fn)
            bug("g_editor_freepdinstance");
        else (*EDITOR->canvas_undo_fn)
            (EDITOR->canvas_undo_canvas, EDITOR->canvas_undo_buf, UNDO_FREE);
    }
    if (EDITOR->canvas_findbuf)
        binbuf_free(EDITOR->canvas_findbuf);
    freebytes(EDITOR, sizeof(*EDITOR));
}